

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Octree.cpp
# Opt level: O2

void __thiscall
Octree::CmdTransferOwnership
          (Octree *this,shared_ptr<myvk::CommandBuffer> *command_buffer,uint32_t src_queue_family,
          uint32_t dst_queue_family,VkPipelineStageFlags src_stage,VkPipelineStageFlags dst_stage)

{
  CommandBuffer *this_00;
  initializer_list<VkBufferMemoryBarrier> __l;
  allocator_type local_a9;
  _Vector_base<VkMemoryBarrier,_std::allocator<VkMemoryBarrier>_> local_a8;
  _Vector_base<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_> local_90;
  _Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_> local_78;
  BufferSubresourceRange local_60;
  VkBufferMemoryBarrier local_50;
  
  this_00 = (command_buffer->super___shared_ptr<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2>).
            _M_ptr;
  local_a8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_60.offset = 0;
  local_60.size = this->m_range;
  myvk::BufferBase::GetMemoryBarrier
            (&local_50,
             &((this->m_buffer).super___shared_ptr<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
              ->super_BufferBase,&local_60,0,0,src_queue_family,dst_queue_family);
  __l._M_len = 1;
  __l._M_array = &local_50;
  std::vector<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_>::vector
            ((vector<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_> *)&local_90,__l,
             &local_a9);
  local_78._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  myvk::CommandBuffer::CmdPipelineBarrier
            (this_00,src_stage,dst_stage,
             (vector<VkMemoryBarrier,_std::allocator<VkMemoryBarrier>_> *)&local_a8,
             (vector<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_> *)&local_90,
             (vector<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_> *)&local_78);
  std::_Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>::~_Vector_base
            (&local_78);
  std::_Vector_base<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_>::~_Vector_base
            (&local_90);
  std::_Vector_base<VkMemoryBarrier,_std::allocator<VkMemoryBarrier>_>::~_Vector_base(&local_a8);
  return;
}

Assistant:

void Octree::CmdTransferOwnership(const std::shared_ptr<myvk::CommandBuffer> &command_buffer, uint32_t src_queue_family,
                                  uint32_t dst_queue_family, VkPipelineStageFlags src_stage,
                                  VkPipelineStageFlags dst_stage) const {
	command_buffer->CmdPipelineBarrier(
	    src_stage, dst_stage, {}, {m_buffer->GetMemoryBarrier({0, m_range}, 0, 0, src_queue_family, dst_queue_family)},
	    {});
}